

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

int32 __thiscall nuraft::raft_server::get_quorum_for_commit(raft_server *this)

{
  element_type *peVar1;
  int32 iVar2;
  int32 iVar3;
  int iVar4;
  __node_base *p_Var5;
  ptr<raft_params> params;
  element_type *local_38;
  
  nuraft::context::get_params((context *)&params);
  iVar3 = get_num_voting_members(this);
  if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      exclude_snp_receiver_from_quorum_ == true) {
    p_Var5 = &(this->peers_)._M_h._M_before_begin;
    iVar2 = iVar3;
    while (iVar3 = iVar2, p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      iVar2 = 0;
      if (iVar3 != 0) {
        peer::get_snapshot_sync_ctx((peer *)&stack0xffffffffffffffc8);
        peVar1 = local_38;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
        iVar2 = iVar3 + -1 + (uint)(peVar1 == (element_type *)0x0);
      }
    }
  }
  iVar4 = (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          custom_commit_quorum_size_;
  if ((iVar4 < 1) || (iVar3 < iVar4)) {
    iVar4 = iVar3 / 2;
  }
  else {
    iVar4 = iVar4 + -1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return iVar4;
}

Assistant:

int32 raft_server::get_quorum_for_commit() {
    ptr<raft_params> params = ctx_->get_params();
    int32 num_voting_members = get_num_voting_members();

    if (params->exclude_snp_receiver_from_quorum_){
        // If the option is on, exclude any peer who is
        // receiving snapshot.
        for (auto& entry: peers_) {
            ptr<peer>& p = entry.second;
            if ( num_voting_members &&
                 p->get_snapshot_sync_ctx() ) {
                num_voting_members--;
            }
        }
    }

    if ( params->custom_commit_quorum_size_ <= 0 ||
         params->custom_commit_quorum_size_ > num_voting_members ) {
        return num_voting_members / 2;
    }
    return params->custom_commit_quorum_size_ - 1;
}